

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::SetPixel(Image *image,uint32_t x,uint32_t y,uint8_t value)

{
  imageException *this;
  
  if ((((image->_data != (uchar *)0x0) && (x < image->_width)) && (y < image->_height)) &&
     (image->_colorCount == '\x01')) {
    image->_data[(ulong)x + (ulong)(y * image->_rowSize)] = value;
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Position of point [x, y] is out of image");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void SetPixel( Image & image, uint32_t x, uint32_t y, uint8_t value )
    {
        if( image.empty() || x >= image.width() || y >= image.height() || image.colorCount() != GRAY_SCALE )
            throw imageException( "Position of point [x, y] is out of image" );

        *(image.data() + y * image.rowSize() + x) = value;
    }